

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndDocument(void *context)

{
  bool bVar1;
  uint uVar2;
  pointer pXVar3;
  element_type *peVar4;
  __shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  XMLParser *state;
  
  pXVar3 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x12792d);
  if ((pXVar3->m_logParsing & 1U) != 0) {
    iDynTree::reportInfo("XMLParser","parserCallbackEndDocument","End document");
  }
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x12795a);
  peVar4 = std::__shared_ptr_access<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x127969);
  uVar2 = (*peVar4->_vptr_XMLDocument[3])();
  if ((uVar2 & 1) == 0) {
    iDynTree::reportError
              ("XMLParser","parserCallbackEndDocument","Document final callback failed processing");
  }
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x12799a);
  bVar1 = std::
          stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
          ::empty((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
                   *)0x1279a9);
  if (!bVar1) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x1279b7);
    std::__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
    iDynTree::reportError("XMLParser","parserCallbackEndDocument","Unbalanced tags in the document")
    ;
  }
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackEndDocument", "End document");
        }

        if (!state->m_pimpl->m_document->documentHasBeenParsed()) {
            reportError("XMLParser", "parserCallbackEndDocument", "Document final callback failed processing");
        }
        
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            // This is an error. Reset the document as it is invalid
            state->m_pimpl->m_document.reset();
            reportError("XMLParser", "parserCallbackEndDocument", "Unbalanced tags in the document");
        }
        
    }